

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O1

void __thiscall
Nova::Grid_Iterator_Cell<float,_3>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_3> *this,Grid<float,_3> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  uint uVar1;
  T_Region TVar2;
  undefined8 uVar3;
  int iVar4;
  Range<int,_3> *pRVar5;
  Range<int,_3> *pRVar6;
  ulong uVar7;
  long lVar8;
  int axis;
  Range<int,_3> *pRVar9;
  bool bVar10;
  Range<int,_3> domain;
  Range<int,_3> domain_copy;
  Range<int,_3> local_58;
  int local_40 [6];
  
  pRVar5 = &local_58;
  pRVar6 = &local_58;
  pRVar9 = &local_58;
  Grid_Iterator<float,_3>::Grid_Iterator(&this->super_Grid_Iterator<float,_3>,grid_input);
  if (6 < (uint)side) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                 );
  }
  if ((*region_type & ~Ghost_Region) == Boundary_Region) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                 );
  }
  Grid<float,_3>::Cell_Indices((this->super_Grid_Iterator<float,_3>).grid,number_of_ghost_cells);
  TVar2 = *region_type;
  if (TVar2 == Boundary_Interior_Region) {
    if (side == 0) {
      local_40[2] = local_58.min_corner._data._M_elems[2];
      local_40[0] = local_58.min_corner._data._M_elems[0];
      local_40[1] = local_58.min_corner._data._M_elems[1];
      local_40[3] = local_58.max_corner._data._M_elems[0];
      local_40[4] = local_58.max_corner._data._M_elems[1];
      local_40[5] = local_58.max_corner._data._M_elems[2];
      lVar8 = 2;
      do {
        local_58.max_corner._data._M_elems[lVar8] = local_58.min_corner._data._M_elems[lVar8];
        Grid_Iterator<float,_3>::Add_Region(&this->super_Grid_Iterator<float,_3>,&local_58);
        iVar4 = local_40[lVar8 + 3];
        local_58.min_corner._data._M_elems[lVar8] = iVar4;
        local_58.max_corner._data._M_elems[lVar8] = iVar4;
        Grid_Iterator<float,_3>::Add_Region(&this->super_Grid_Iterator<float,_3>,&local_58);
        local_58.max_corner._data._M_elems[lVar8] = iVar4 + -1;
        local_58.min_corner._data._M_elems[lVar8] = local_40[lVar8] + 1;
        bVar10 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar10);
      goto LAB_0011eb75;
    }
    uVar1 = side - 1;
    uVar7 = (ulong)(uVar1 >> 1);
    if ((side & 1U) == 0) {
      if (5 < uVar1) {
LAB_0011ec1c:
        std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar7,3)
        ;
      }
      pRVar6 = (Range<int,_3> *)&local_58.max_corner;
    }
    else {
      if (5 < uVar1) goto LAB_0011ec1c;
      pRVar5 = (Range<int,_3> *)&local_58.max_corner;
    }
    (pRVar5->min_corner)._data._M_elems[uVar7] = (pRVar6->min_corner)._data._M_elems[uVar7];
  }
  else if (TVar2 == Whole_Region) {
    if (side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                   );
    }
  }
  else {
    if ((number_of_ghost_cells < 1) || (TVar2 != Ghost_Region)) {
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                   );
    }
    if (side == 0) {
      local_40[2] = local_58.max_corner._data._M_elems[2];
      local_40[0] = local_58.max_corner._data._M_elems[0];
      local_40[1] = local_58.max_corner._data._M_elems[1];
      lVar8 = 0;
      do {
        *(undefined4 *)((long)local_58.max_corner._data._M_elems + lVar8 + 8) = 0;
        Grid_Iterator<float,_3>::Add_Region(&this->super_Grid_Iterator<float,_3>,&local_58);
        *(undefined4 *)((long)local_58.max_corner._data._M_elems + lVar8 + 8) =
             *(undefined4 *)((long)local_40 + lVar8 + 8);
        *(int *)((long)local_58.min_corner._data._M_elems + lVar8 + 8) =
             *(int *)((long)(((this->super_Grid_Iterator<float,_3>).grid)->counts)._data._M_elems +
                     lVar8 + 8) + 1;
        Grid_Iterator<float,_3>::Add_Region(&this->super_Grid_Iterator<float,_3>,&local_58);
        *(undefined4 *)((long)local_58.max_corner._data._M_elems + lVar8 + 8) =
             *(undefined4 *)
              ((long)(((this->super_Grid_Iterator<float,_3>).grid)->counts)._data._M_elems +
              lVar8 + 8);
        *(undefined4 *)((long)local_58.min_corner._data._M_elems + lVar8 + 8) = 1;
        lVar8 = lVar8 + -4;
      } while (lVar8 != -0xc);
      goto LAB_0011eb75;
    }
    uVar7 = (ulong)(side - 1U >> 1);
    if ((side & 1U) == 0) {
      iVar4 = (((this->super_Grid_Iterator<float,_3>).grid)->counts)._data._M_elems[uVar7] + 1;
    }
    else {
      if (5 < side - 1U) goto LAB_0011ec1c;
      iVar4 = 0;
      pRVar9 = (Range<int,_3> *)&local_58.max_corner;
    }
    (pRVar9->min_corner)._data._M_elems[uVar7] = iVar4;
  }
  Grid_Iterator<float,_3>::Add_Region(&this->super_Grid_Iterator<float,_3>,&local_58);
LAB_0011eb75:
  iVar4 = (this->super_Grid_Iterator<float,_3>).number_of_regions;
  (this->super_Grid_Iterator<float,_3>).valid = 0 < iVar4;
  if (0 < iVar4) {
    (this->super_Grid_Iterator<float,_3>).current_region = 0;
    uVar3 = *(undefined8 *)
             (this->super_Grid_Iterator<float,_3>).regions[0].min_corner._data._M_elems;
    *(undefined8 *)(this->super_Grid_Iterator<float,_3>).region.min_corner._data._M_elems = uVar3;
    iVar4 = (this->super_Grid_Iterator<float,_3>).regions[0].min_corner._data._M_elems[2];
    (this->super_Grid_Iterator<float,_3>).region.min_corner._data._M_elems[2] = iVar4;
    *(undefined8 *)(this->super_Grid_Iterator<float,_3>).region.max_corner._data._M_elems =
         *(undefined8 *)(this->super_Grid_Iterator<float,_3>).regions[0].max_corner._data._M_elems;
    (this->super_Grid_Iterator<float,_3>).region.max_corner._data._M_elems[2] =
         (this->super_Grid_Iterator<float,_3>).regions[0].max_corner._data._M_elems[2];
    *(undefined8 *)(this->super_Grid_Iterator<float,_3>).index._data._M_elems = uVar3;
    (this->super_Grid_Iterator<float,_3>).index._data._M_elems[2] = iVar4;
  }
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}